

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalCopyDatabase,duckdb::vector<duckdb::LogicalType,true>&,unsigned_long&,duckdb::unique_ptr<duckdb::CopyDatabaseInfo,std::default_delete<duckdb::CopyDatabaseInfo>,true>>
          (PhysicalPlan *this,vector<duckdb::LogicalType,_true> *args,unsigned_long *args_1,
          unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>
          *args_2)

{
  idx_t estimated_cardinality;
  PhysicalCopyDatabase *this_00;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::CopyDatabaseInfo_*,_false> local_58;
  reference_wrapper<duckdb::PhysicalOperator> local_50;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  this_00 = (PhysicalCopyDatabase *)ArenaAllocator::AllocateAligned(&this->arena,0x88);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_48,
             &args->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  estimated_cardinality = *args_1;
  local_58._M_head_impl =
       (args_2->
       super_unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::CopyDatabaseInfo_*,_std::default_delete<duckdb::CopyDatabaseInfo>_>
       .super__Head_base<0UL,_duckdb::CopyDatabaseInfo_*,_false>._M_head_impl;
  (args_2->
  super_unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>_>)._M_t.
  super___uniq_ptr_impl<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::CopyDatabaseInfo_*,_std::default_delete<duckdb::CopyDatabaseInfo>_>
  .super__Head_base<0UL,_duckdb::CopyDatabaseInfo_*,_false>._M_head_impl = (CopyDatabaseInfo *)0x0;
  PhysicalCopyDatabase::PhysicalCopyDatabase
            (this_00,(vector<duckdb::LogicalType,_true> *)&local_48,estimated_cardinality,
             (unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>
              *)&local_58);
  if (local_58._M_head_impl != (CopyDatabaseInfo *)0x0) {
    (*((local_58._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  local_58._M_head_impl = (CopyDatabaseInfo *)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  local_50._M_data = (PhysicalOperator *)this_00;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)&this->ops,&local_50);
  return &this_00->super_PhysicalOperator;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}